

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-util.c
# Opt level: O0

void player_resting_set_count(player *p,int16_t count)

{
  _Bool _Var1;
  int16_t count_local;
  player *p_local;
  
  if (player_rest_disturb) {
    p->upkeep->resting = L'\0';
    player_rest_disturb = false;
  }
  else {
    if ((count < 0) && (_Var1 = player_resting_is_special(count), !_Var1)) {
      p->upkeep->resting = L'\0';
      return;
    }
    p->upkeep->resting = (int)count;
    if (L'✏' < p->upkeep->resting) {
      p->upkeep->resting = L'✏';
    }
  }
  return;
}

Assistant:

void player_resting_set_count(struct player *p, int16_t count)
{
	/* Cancel if player is disturbed */
	if (player_rest_disturb) {
		p->upkeep->resting = 0;
		player_rest_disturb = false;
		return;
	}

	/* Ignore if the rest count is negative. */
	if ((count < 0) && !player_resting_is_special(count)) {
		p->upkeep->resting = 0;
		return;
	}

	/* Save the rest code */
	p->upkeep->resting = count;

	/* Truncate overlarge values */
	if (p->upkeep->resting > 9999) p->upkeep->resting = 9999;
}